

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::Renderer(Renderer *this,float sample_rate,char *args)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  char *name;
  ulong uVar4;
  Voice *pVVar5;
  char *args_local;
  float sample_rate_local;
  Renderer *this_local;
  
  this->rate = sample_rate;
  this->patches = (DLS_Data *)0x0;
  this->resample_buffer_size = 0;
  this->resample_buffer = (sample_t *)0x0;
  this->voice = (Voice *)0x0;
  this->adjust_panning_immediately = 0;
  iVar3 = clamp<int>((int)(this->rate / 1000.0),1,0xff);
  this->control_ratio = iVar3;
  this->lost_notes = 0;
  this->cut_notes = 0;
  this->default_instrument = (Instrument *)0x0;
  this->default_program = 0;
  bVar2 = FString::IsNotEmpty((FString *)&def_instr_name);
  if (bVar2) {
    name = FString::operator_cast_to_char_((FString *)&def_instr_name);
    set_default_instrument(this,name);
  }
  iVar3 = FIntCVar::operator*(&midi_voices);
  iVar3 = MAX<int>(iVar3,0x10);
  this->voices = iVar3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->voices;
  uVar4 = SUB168(auVar1 * ZEXT816(0x170),0);
  if (SUB168(auVar1 * ZEXT816(0x170),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pVVar5 = (Voice *)operator_new__(uVar4);
  this->voice = pVVar5;
  this->drumchannels = 0x200;
  return;
}

Assistant:

Renderer::Renderer(float sample_rate, const char *args)
{
	// 'args' should be used to load a custom config or DMXGUS, but since setup currently requires a snd_reset call, this will need some refactoring first
	rate = sample_rate;
	patches = NULL;
	resample_buffer_size = 0;
	resample_buffer = NULL;
	voice = NULL;
	adjust_panning_immediately = false;

	control_ratio = clamp(int(rate / CONTROLS_PER_SECOND), 1, MAX_CONTROL_RATIO);

	lost_notes = 0;
	cut_notes = 0;

	default_instrument = NULL;
	default_program = DEFAULT_PROGRAM;
	if (def_instr_name.IsNotEmpty())
		set_default_instrument(def_instr_name);

	voices = MAX(*midi_voices, 16);
	voice = new Voice[voices];
	drumchannels = DEFAULT_DRUMCHANNELS;
#if 0
	FILE *f = fopen("c:\\windows\\system32\\drivers\\gm.dls", "rb");
	patches = LoadDLS(f);
	fclose(f);
#endif
}